

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O0

void mocker::anon_unknown_2::allocate
               (shared_ptr<mocker::nasm::Inst> *inst,RegMap<std::size_t> *offsets,Section *text)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Section *pSVar2;
  bool bVar3;
  bool bVar4;
  element_type *peVar5;
  element_type *this;
  element_type *this_00;
  element_type *peVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *this_01;
  shared_ptr<mocker::nasm::Addr> *psVar10;
  shared_ptr<mocker::nasm::Register> *psVar11;
  bool local_341;
  shared_ptr<mocker::nasm::Inst> local_340;
  undefined1 local_330 [8];
  shared_ptr<mocker::nasm::Register> reg_10;
  shared_ptr<mocker::nasm::IDiv> p_8;
  OpType local_2fc;
  shared_ptr<mocker::nasm::Inst> local_2f8;
  shared_ptr<mocker::nasm::Addr> local_2e8;
  undefined1 local_2d8 [8];
  shared_ptr<mocker::nasm::Register> reg_9;
  shared_ptr<mocker::nasm::UnaryInst> p_7;
  OpType local_2a4;
  undefined1 local_2a0 [8];
  shared_ptr<mocker::nasm::Register> tmp;
  shared_ptr<mocker::nasm::Addr> local_280;
  undefined1 local_270 [8];
  shared_ptr<mocker::nasm::Register> reg_8;
  shared_ptr<mocker::nasm::Set> p_6;
  shared_ptr<mocker::nasm::Register> reg_7;
  shared_ptr<mocker::nasm::Addr> rhs_1;
  shared_ptr<mocker::nasm::Register> reg_6;
  shared_ptr<mocker::nasm::Addr> lhs_1;
  shared_ptr<mocker::nasm::Cmp> p_5;
  shared_ptr<mocker::nasm::Addr> local_1f0;
  undefined1 local_1e0 [8];
  shared_ptr<mocker::nasm::Register> reg_5;
  shared_ptr<mocker::nasm::Lea> p_4;
  shared_ptr<mocker::nasm::Addr> local_1b0;
  undefined1 local_1a0 [8];
  shared_ptr<mocker::nasm::Register> reg_4;
  shared_ptr<mocker::nasm::Pop> p_3;
  undefined1 local_170 [8];
  shared_ptr<mocker::nasm::Register> reg_3;
  shared_ptr<mocker::nasm::Push> p_2;
  shared_ptr<mocker::nasm::Register> reg_2;
  undefined1 local_138 [8];
  shared_ptr<mocker::nasm::Register> reg_1;
  shared_ptr<mocker::nasm::Addr> lhs;
  shared_ptr<mocker::nasm::Register> reg;
  shared_ptr<mocker::nasm::Addr> rhs;
  shared_ptr<mocker::nasm::BinaryInst> p_1;
  undefined1 local_e0 [8];
  shared_ptr<mocker::nasm::Mov> p;
  anon_class_16_2_521579e4 store;
  anon_class_16_2_521579e4 load;
  shared_ptr<mocker::nasm::Cqo> local_98;
  byte local_81;
  shared_ptr<mocker::nasm::Inst> local_80;
  byte local_69;
  shared_ptr<mocker::nasm::Inst> local_68;
  byte local_55;
  shared_ptr<mocker::nasm::Call> local_48;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_38;
  Section *local_20;
  Section *text_local;
  RegMap<std::size_t> *offsets_local;
  shared_ptr<mocker::nasm::Inst> *inst_local;
  
  local_20 = text;
  text_local = (Section *)offsets;
  offsets_local = (RegMap<std::size_t> *)inst;
  nasm::getInvolvedRegs(&local_38,inst);
  bVar3 = std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::empty(&local_38);
  local_55 = 0;
  local_69 = 0;
  local_81 = 0;
  bVar4 = false;
  local_341 = true;
  if (!bVar3) {
    nasm::dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>
              ((shared_ptr<mocker::nasm::Inst> *)&local_48);
    local_55 = 1;
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_48);
    local_341 = true;
    if (!bVar3) {
      nasm::dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>(&local_68);
      local_69 = 1;
      bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_68);
      local_341 = true;
      if (!bVar3) {
        nasm::dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>(&local_80);
        local_81 = 1;
        bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_80);
        local_341 = true;
        if (!bVar3) {
          nasm::dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((shared_ptr<mocker::nasm::Inst> *)&local_98);
          bVar4 = true;
          local_341 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_98);
        }
      }
    }
  }
  if (bVar4) {
    std::shared_ptr<mocker::nasm::Cqo>::~shared_ptr(&local_98);
  }
  if ((local_81 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Ret>::~shared_ptr((shared_ptr<mocker::nasm::Ret> *)&local_80);
  }
  if ((local_69 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Leave>::~shared_ptr((shared_ptr<mocker::nasm::Leave> *)&local_68);
  }
  if ((local_55 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Call>::~shared_ptr(&local_48);
  }
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::~vector(&local_38);
  pSVar2 = local_20;
  if (local_341 == false) {
    store.text = text_local;
    load.offsets = (RegMap<std::size_t> *)local_20;
    p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)text_local;
    store.offsets = (RegMap<std::size_t> *)local_20;
    nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>
              ((shared_ptr<mocker::nasm::Inst> *)local_e0);
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_e0);
    if (bVar4) {
      allocateMov((shared_ptr<mocker::nasm::Mov> *)local_e0,(RegMap<std::size_t> *)text_local,
                  local_20);
    }
    std::shared_ptr<mocker::nasm::Mov>::~shared_ptr((shared_ptr<mocker::nasm::Mov> *)local_e0);
    if (!bVar4) {
      nasm::dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                ((shared_ptr<mocker::nasm::Inst> *)
                 &rhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      bVar4 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &rhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar4) {
        peVar5 = std::
                 __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&rhs.
                                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        psVar10 = nasm::BinaryInst::getRhs(peVar5);
        p_Var1 = &reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        std::shared_ptr<mocker::nasm::Addr>::shared_ptr
                  ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar10);
        dycVReg((anon_unknown_2 *)
                &lhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                (shared_ptr<mocker::nasm::Addr> *)p_Var1);
        bVar4 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &lhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar4) {
          psVar11 = nasm::r10();
          allocate::anon_class_16_2_521579e4::operator()
                    ((anon_class_16_2_521579e4 *)&store.text,psVar11,
                     (shared_ptr<mocker::nasm::Register> *)
                     &lhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          psVar11 = nasm::r10();
          std::shared_ptr<mocker::nasm::Addr>::operator=
                    ((shared_ptr<mocker::nasm::Addr> *)
                     &reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,psVar11);
        }
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)
                   &lhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        peVar5 = std::
                 __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&rhs.
                                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        psVar10 = nasm::BinaryInst::getLhs(peVar5);
        p_Var1 = &reg_1.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
        std::shared_ptr<mocker::nasm::Addr>::shared_ptr
                  ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar10);
        dycVReg((anon_unknown_2 *)local_138,(shared_ptr<mocker::nasm::Addr> *)p_Var1);
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_138);
        if (bVar4) {
          psVar11 = nasm::r11();
          allocate::anon_class_16_2_521579e4::operator()
                    ((anon_class_16_2_521579e4 *)&store.text,psVar11,
                     (shared_ptr<mocker::nasm::Register> *)local_138);
          psVar11 = nasm::r11();
          std::shared_ptr<mocker::nasm::Addr>::operator=
                    ((shared_ptr<mocker::nasm::Addr> *)
                     &reg_1.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,psVar11);
        }
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)local_138);
        pSVar2 = local_20;
        peVar5 = std::
                 __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&rhs.
                                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        reg_2.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = nasm::BinaryInst::getType(peVar5);
        nasm::Section::
        emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                  (pSVar2,(OpType *)
                          ((long)&reg_2.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 4),
                   (shared_ptr<mocker::nasm::Addr> *)
                   &reg_1.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   (shared_ptr<mocker::nasm::Addr> *)
                   &reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        peVar5 = std::
                 __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&rhs.
                                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        psVar10 = nasm::BinaryInst::getLhs(peVar5);
        dycVReg((anon_unknown_2 *)
                &p_2.super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                psVar10);
        bVar4 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &p_2.super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar4) {
          allocate::anon_class_16_2_521579e4::operator()
                    ((anon_class_16_2_521579e4 *)
                     &p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (shared_ptr<mocker::nasm::Register> *)
                     &p_2.super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (shared_ptr<mocker::nasm::Addr> *)
                     &reg_1.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)
                   &p_2.super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar4 = true;
        std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Addr> *)
                   &reg_1.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Addr> *)
                   &reg.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        bVar4 = false;
      }
      std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr
                ((shared_ptr<mocker::nasm::BinaryInst> *)
                 &rhs.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      if (!bVar4) {
        nasm::dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((shared_ptr<mocker::nasm::Inst> *)
                   &reg_3.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar4 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &reg_3.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar4) {
          this = std::
                 __shared_ptr_access<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&reg_3.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
          psVar11 = nasm::Push::getReg(this);
          p_Var1 = &p_3.super___shared_ptr<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
          std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                    ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar11);
          dycVReg((anon_unknown_2 *)local_170,(shared_ptr<mocker::nasm::Addr> *)p_Var1);
          std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Addr> *)
                     &p_3.super___shared_ptr<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_170);
          if (!bVar4) {
            __assert_fail("reg",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                          ,0xab,
                          "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                         );
          }
          psVar11 = nasm::r10();
          allocate::anon_class_16_2_521579e4::operator()
                    ((anon_class_16_2_521579e4 *)&store.text,psVar11,
                     (shared_ptr<mocker::nasm::Register> *)local_170);
          pSVar2 = local_20;
          psVar11 = nasm::r10();
          nasm::Section::
          emplaceInst<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>const&>
                    (pSVar2,psVar11);
          bVar4 = true;
          std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Register> *)local_170);
        }
        else {
          bVar4 = false;
        }
        std::shared_ptr<mocker::nasm::Push>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Push> *)
                   &reg_3.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (!bVar4) {
          nasm::dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((shared_ptr<mocker::nasm::Inst> *)
                     &reg_4.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          bVar4 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)
                             &reg_4.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
          if (bVar4) {
            this_00 = std::
                      __shared_ptr_access<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::nasm::Pop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&reg_4.
                                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
            psVar11 = nasm::Pop::getReg(this_00);
            std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                      (&local_1b0,psVar11);
            dycVReg((anon_unknown_2 *)local_1a0,&local_1b0);
            std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_1b0);
            bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1a0);
            pSVar2 = local_20;
            if (!bVar4) {
              __assert_fail("reg",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                            ,0xb2,
                            "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                           );
            }
            psVar11 = nasm::r10();
            nasm::Section::
            emplaceInst<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Register>const&>
                      (pSVar2,psVar11);
            psVar11 = nasm::r10();
            p_Var1 = &p_4.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                      ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar11);
            allocate::anon_class_16_2_521579e4::operator()
                      ((anon_class_16_2_521579e4 *)
                       &p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(shared_ptr<mocker::nasm::Register> *)local_1a0,
                       (shared_ptr<mocker::nasm::Addr> *)p_Var1);
            std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                      ((shared_ptr<mocker::nasm::Addr> *)
                       &p_4.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            bVar4 = true;
            std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                      ((shared_ptr<mocker::nasm::Register> *)local_1a0);
          }
          else {
            bVar4 = false;
          }
          std::shared_ptr<mocker::nasm::Pop>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Pop> *)
                     &reg_4.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          if (!bVar4) {
            nasm::dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((shared_ptr<mocker::nasm::Inst> *)
                       &reg_5.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            bVar4 = std::__shared_ptr::operator_cast_to_bool
                              ((__shared_ptr *)
                               &reg_5.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
            if (bVar4) {
              peVar6 = std::
                       __shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&reg_5.
                                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
              psVar11 = nasm::Lea::getDest(peVar6);
              std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                        (&local_1f0,psVar11);
              dycVReg((anon_unknown_2 *)local_1e0,&local_1f0);
              std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_1f0);
              bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1e0);
              pSVar2 = local_20;
              if (bVar4) {
                psVar11 = nasm::r10();
                peVar6 = std::
                         __shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&reg_5.
                                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                psVar10 = nasm::Lea::getAddr(peVar6);
                nasm::Section::
                emplaceInst<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>const&>
                          (pSVar2,psVar11,psVar10);
                psVar11 = nasm::r10();
                p_Var1 = &p_5.super___shared_ptr<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                          ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar11);
                allocate::anon_class_16_2_521579e4::operator()
                          ((anon_class_16_2_521579e4 *)
                           &p.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(shared_ptr<mocker::nasm::Register> *)local_1e0,
                           (shared_ptr<mocker::nasm::Addr> *)p_Var1);
                std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Addr> *)
                           &p_5.super___shared_ptr<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              bVar4 = true;
              std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                        ((shared_ptr<mocker::nasm::Register> *)local_1e0);
            }
            else {
              bVar4 = false;
            }
            std::shared_ptr<mocker::nasm::Lea>::~shared_ptr
                      ((shared_ptr<mocker::nasm::Lea> *)
                       &reg_5.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            if (!bVar4) {
              nasm::dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                        ((shared_ptr<mocker::nasm::Inst> *)
                         &lhs_1.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              bVar4 = std::__shared_ptr::operator_cast_to_bool
                                ((__shared_ptr *)
                                 &lhs_1.
                                  super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
              if (bVar4) {
                peVar7 = std::
                         __shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&lhs_1.
                                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                psVar10 = nasm::Cmp::getLhs(peVar7);
                p_Var1 = &reg_6.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                std::shared_ptr<mocker::nasm::Addr>::shared_ptr
                          ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar10);
                dycVReg((anon_unknown_2 *)
                        &rhs_1.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(shared_ptr<mocker::nasm::Addr> *)p_Var1);
                bVar4 = std::__shared_ptr::operator_cast_to_bool
                                  ((__shared_ptr *)
                                   &rhs_1.
                                    super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                if (bVar4) {
                  psVar11 = nasm::r10();
                  loadVReg(psVar11,(shared_ptr<mocker::nasm::Register> *)
                                   &rhs_1.
                                    super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(RegMap<std::size_t> *)text_local,local_20);
                  psVar11 = nasm::r10();
                  std::shared_ptr<mocker::nasm::Addr>::operator=
                            ((shared_ptr<mocker::nasm::Addr> *)
                             &reg_6.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,psVar11);
                }
                std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Register> *)
                           &rhs_1.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                peVar7 = std::
                         __shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&lhs_1.
                                          super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                psVar10 = nasm::Cmp::getRhs(peVar7);
                p_Var1 = &reg_7.
                          super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount;
                std::shared_ptr<mocker::nasm::Addr>::shared_ptr
                          ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar10);
                dycVReg((anon_unknown_2 *)
                        &p_6.super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(shared_ptr<mocker::nasm::Addr> *)p_Var1);
                bVar4 = std::__shared_ptr::operator_cast_to_bool
                                  ((__shared_ptr *)
                                   &p_6.
                                    super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                if (bVar4) {
                  psVar11 = nasm::r11();
                  loadVReg(psVar11,(shared_ptr<mocker::nasm::Register> *)
                                   &p_6.
                                    super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(RegMap<std::size_t> *)text_local,local_20);
                  psVar11 = nasm::r11();
                  std::shared_ptr<mocker::nasm::Addr>::operator=
                            ((shared_ptr<mocker::nasm::Addr> *)
                             &reg_7.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,psVar11);
                }
                std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Register> *)
                           &p_6.super___shared_ptr<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                nasm::Section::
                emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                          (local_20,(shared_ptr<mocker::nasm::Addr> *)
                                    &reg_6.
                                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount,
                           (shared_ptr<mocker::nasm::Addr> *)
                           &reg_7.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                bVar4 = true;
                std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Addr> *)
                           &reg_7.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Addr> *)
                           &reg_6.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              else {
                bVar4 = false;
              }
              std::shared_ptr<mocker::nasm::Cmp>::~shared_ptr
                        ((shared_ptr<mocker::nasm::Cmp> *)
                         &lhs_1.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              if (!bVar4) {
                nasm::dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>
                          ((shared_ptr<mocker::nasm::Inst> *)
                           &reg_8.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                bVar4 = std::__shared_ptr::operator_cast_to_bool
                                  ((__shared_ptr *)
                                   &reg_8.
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                if (bVar4) {
                  peVar8 = std::
                           __shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)&reg_8.
                                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                  psVar11 = nasm::Set::getReg(peVar8);
                  std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                            (&local_280,psVar11);
                  dycVReg((anon_unknown_2 *)local_270,&local_280);
                  std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_280);
                  bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_270);
                  pSVar2 = local_20;
                  if (bVar4) {
                    std::make_shared<mocker::nasm::Register,char_const(&)[5]>
                              ((char (*) [5])local_2a0);
                    pSVar2 = local_20;
                    peVar8 = std::
                             __shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<mocker::nasm::Set,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&reg_8.
                                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
                    local_2a4 = nasm::Set::getOp(peVar8);
                    nasm::Section::
                    emplaceInst<mocker::nasm::Set,mocker::nasm::Set::OpType,std::shared_ptr<mocker::nasm::Register>&>
                              (pSVar2,&local_2a4,(shared_ptr<mocker::nasm::Register> *)local_2a0);
                    psVar11 = nasm::r10();
                    p_Var1 = &p_7.
                              super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount;
                    std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                              ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar11);
                    storeVReg((shared_ptr<mocker::nasm::Register> *)local_270,
                              (shared_ptr<mocker::nasm::Addr> *)p_Var1,
                              (RegMap<std::size_t> *)text_local,local_20);
                    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                              ((shared_ptr<mocker::nasm::Addr> *)
                               &p_7.
                                super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                              ((shared_ptr<mocker::nasm::Register> *)local_2a0);
                  }
                  else {
                    p_Var1 = &tmp.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount;
                    std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::Set,void>
                              ((shared_ptr<mocker::nasm::Inst> *)p_Var1,
                               (shared_ptr<mocker::nasm::Set> *)
                               &reg_8.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    nasm::Section::appendInst(pSVar2,(shared_ptr<mocker::nasm::Inst> *)p_Var1);
                    std::shared_ptr<mocker::nasm::Inst>::~shared_ptr
                              ((shared_ptr<mocker::nasm::Inst> *)
                               &tmp.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                  bVar4 = true;
                  std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                            ((shared_ptr<mocker::nasm::Register> *)local_270);
                }
                else {
                  bVar4 = false;
                }
                std::shared_ptr<mocker::nasm::Set>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Set> *)
                           &reg_8.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                if (!bVar4) {
                  nasm::dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                            ((shared_ptr<mocker::nasm::Inst> *)
                             &reg_9.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  bVar4 = std::__shared_ptr::operator_cast_to_bool
                                    ((__shared_ptr *)
                                     &reg_9.
                                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                  if (bVar4) {
                    peVar9 = std::
                             __shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&reg_9.
                                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
                    psVar11 = nasm::UnaryInst::getReg(peVar9);
                    std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                              (&local_2e8,psVar11);
                    dycVReg((anon_unknown_2 *)local_2d8,&local_2e8);
                    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr(&local_2e8);
                    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2d8);
                    pSVar2 = local_20;
                    if (bVar4) {
                      psVar11 = nasm::r10();
                      allocate::anon_class_16_2_521579e4::operator()
                                ((anon_class_16_2_521579e4 *)&store.text,psVar11,
                                 (shared_ptr<mocker::nasm::Register> *)local_2d8);
                      pSVar2 = local_20;
                      peVar9 = std::
                               __shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)&reg_9.
                                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                      local_2fc = nasm::UnaryInst::getOp(peVar9);
                      psVar11 = nasm::r10();
                      nasm::Section::
                      emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&>
                                (pSVar2,&local_2fc,psVar11);
                      psVar11 = nasm::r10();
                      p_Var1 = &p_8.
                                super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount;
                      std::shared_ptr<mocker::nasm::Addr>::shared_ptr<mocker::nasm::Register,void>
                                ((shared_ptr<mocker::nasm::Addr> *)p_Var1,psVar11);
                      allocate::anon_class_16_2_521579e4::operator()
                                ((anon_class_16_2_521579e4 *)
                                 &p.
                                  super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,(shared_ptr<mocker::nasm::Register> *)local_2d8,
                                 (shared_ptr<mocker::nasm::Addr> *)p_Var1);
                      std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                                ((shared_ptr<mocker::nasm::Addr> *)
                                 &p_8.
                                  super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                    else {
                      std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::UnaryInst,void>
                                (&local_2f8,
                                 (shared_ptr<mocker::nasm::UnaryInst> *)
                                 &reg_9.
                                  super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                      nasm::Section::appendInst(pSVar2,&local_2f8);
                      std::shared_ptr<mocker::nasm::Inst>::~shared_ptr(&local_2f8);
                    }
                    bVar4 = true;
                    std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                              ((shared_ptr<mocker::nasm::Register> *)local_2d8);
                  }
                  else {
                    bVar4 = false;
                  }
                  std::shared_ptr<mocker::nasm::UnaryInst>::~shared_ptr
                            ((shared_ptr<mocker::nasm::UnaryInst> *)
                             &reg_9.
                              super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  if (!bVar4) {
                    nasm::dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                              ((shared_ptr<mocker::nasm::Inst> *)
                               &reg_10.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    bVar4 = std::__shared_ptr::operator_cast_to_bool
                                      ((__shared_ptr *)
                                       &reg_10.
                                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                    if (bVar4) {
                      this_01 = std::
                                __shared_ptr_access<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)&reg_10.
                                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount);
                      psVar10 = nasm::IDiv::getRhs(this_01);
                      dycVReg((anon_unknown_2 *)local_330,psVar10);
                      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_330);
                      pSVar2 = local_20;
                      if (bVar4) {
                        psVar11 = nasm::r10();
                        allocate::anon_class_16_2_521579e4::operator()
                                  ((anon_class_16_2_521579e4 *)&store.text,psVar11,
                                   (shared_ptr<mocker::nasm::Register> *)local_330);
                        pSVar2 = local_20;
                        psVar11 = nasm::r10();
                        nasm::Section::
                        emplaceInst<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Register>const&>
                                  (pSVar2,psVar11);
                      }
                      else {
                        std::shared_ptr<mocker::nasm::Inst>::shared_ptr<mocker::nasm::IDiv,void>
                                  (&local_340,
                                   (shared_ptr<mocker::nasm::IDiv> *)
                                   &reg_10.
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                        nasm::Section::appendInst(pSVar2,&local_340);
                        std::shared_ptr<mocker::nasm::Inst>::~shared_ptr(&local_340);
                      }
                      bVar4 = true;
                      std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                                ((shared_ptr<mocker::nasm::Register> *)local_330);
                    }
                    else {
                      bVar4 = false;
                    }
                    std::shared_ptr<mocker::nasm::IDiv>::~shared_ptr
                              ((shared_ptr<mocker::nasm::IDiv> *)
                               &reg_10.
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                    if (!bVar4) {
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/naive_register_allocation.cpp"
                                    ,0xee,
                                    "void mocker::(anonymous namespace)::allocate(const std::shared_ptr<nasm::Inst> &, const RegMap<std::size_t> &, nasm::Section &)"
                                   );
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::shared_ptr<mocker::nasm::Inst>::shared_ptr
              ((shared_ptr<mocker::nasm::Inst> *)&load.text,
               (shared_ptr<mocker::nasm::Inst> *)offsets_local);
    nasm::Section::appendInst(pSVar2,(shared_ptr<mocker::nasm::Inst> *)&load.text);
    std::shared_ptr<mocker::nasm::Inst>::~shared_ptr((shared_ptr<mocker::nasm::Inst> *)&load.text);
  }
  return;
}

Assistant:

void allocate(const std::shared_ptr<nasm::Inst> &inst,
              const RegMap<std::size_t> &offsets, nasm::Section &text) {
  if (nasm::getInvolvedRegs(inst).empty() || nasm::dyc<nasm::Call>(inst) ||
      nasm::dyc<nasm::Leave>(inst) || nasm::dyc<nasm::Ret>(inst) ||
      nasm::dyc<nasm::Cqo>(inst)) {
    text.appendInst(inst);
    return;
  }
  auto load = [&offsets, &text](const std::shared_ptr<nasm::Register> &dest,
                                const std::shared_ptr<nasm::Register> &src) {
    loadVReg(dest, src, offsets, text);
  };
  auto store = [&offsets, &text](const std::shared_ptr<nasm::Register> &dest,
                                 const std::shared_ptr<nasm::Addr> &val) {
    storeVReg(dest, val, offsets, text);
  };

  if (auto p = nasm::dyc<nasm::Mov>(inst)) {
    allocateMov(p, offsets, text);
    return;
  }
  if (auto p = nasm::dyc<nasm::BinaryInst>(inst)) {
    auto rhs = p->getRhs();
    if (auto reg = dycVReg(rhs)) {
      load(nasm::r10(), reg);
      rhs = nasm::r10();
    }
    auto lhs = p->getLhs();
    if (auto reg = dycVReg(lhs)) {
      load(nasm::r11(), reg);
      lhs = nasm::r11();
    }
    text.emplaceInst<nasm::BinaryInst>(p->getType(), lhs, rhs);
    if (auto reg = dycVReg(p->getLhs()))
      store(reg, lhs);
    return;
  }
  if (auto p = nasm::dyc<nasm::Push>(inst)) {
    auto reg = dycVReg(p->getReg());
    assert(reg);
    load(nasm::r10(), reg);
    text.emplaceInst<nasm::Push>(nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::Pop>(inst)) {
    auto reg = dycVReg(p->getReg());
    assert(reg);
    text.emplaceInst<nasm::Pop>(nasm::r10());
    store(reg, nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::Lea>(inst)) {
    auto reg = dycVReg(p->getDest());
    if (!reg)
      return;
    text.emplaceInst<nasm::Lea>(nasm::r10(), p->getAddr());
    store(reg, nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::Cmp>(inst)) {
    auto lhs = p->getLhs();
    if (auto reg = dycVReg(lhs)) {
      loadVReg(nasm::r10(), reg, offsets, text);
      lhs = nasm::r10();
    }
    auto rhs = p->getRhs();
    if (auto reg = dycVReg(rhs)) {
      loadVReg(nasm::r11(), reg, offsets, text);
      rhs = nasm::r11();
    }
    text.emplaceInst<nasm::Cmp>(lhs, rhs);
    return;
  }
  if (auto p = nasm::dyc<nasm::Set>(inst)) {
    auto reg = dycVReg(p->getReg());
    if (!reg) {
      text.appendInst(p);
      return;
    }
    auto tmp = std::make_shared<nasm::Register>("r10b");
    text.emplaceInst<nasm::Set>(p->getOp(), tmp);
    storeVReg(reg, nasm::r10(), offsets, text);
    return;
  }
  if (auto p = nasm::dyc<nasm::UnaryInst>(inst)) {
    auto reg = dycVReg(p->getReg());
    if (!reg) {
      text.appendInst(p);
      return;
    }
    load(nasm::r10(), reg);
    text.emplaceInst<nasm::UnaryInst>(p->getOp(), nasm::r10());
    store(reg, nasm::r10());
    return;
  }
  if (auto p = nasm::dyc<nasm::IDiv>(inst)) {
    auto reg = dycVReg(p->getRhs());
    if (!reg) {
      text.appendInst(p);
      return;
    }
    load(nasm::r10(), reg);
    text.emplaceInst<nasm::IDiv>(nasm::r10());
    return;
  }

  assert(false);
}